

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufferAdd(xmlBufferPtr buf,xmlChar *str,int len)

{
  int iVar1;
  uint uVar2;
  
  if (str == (xmlChar *)0x0 || buf == (xmlBufferPtr)0x0) {
    iVar1 = 0x73;
  }
  else {
    if (len < 0) {
      len = xmlStrlen(str);
    }
    iVar1 = 0;
    if (len != 0) {
      uVar2 = buf->use;
      if (buf->size - uVar2 <= (uint)len) {
        iVar1 = xmlBufferGrow(buf,len);
        if (iVar1 < 0) {
          return 2;
        }
        uVar2 = buf->use;
      }
      memmove(buf->content + uVar2,str,(long)len);
      uVar2 = len + buf->use;
      buf->use = uVar2;
      buf->content[uVar2] = '\0';
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlBufferAdd(xmlBufferPtr buf, const xmlChar *str, int len) {
    if ((buf == NULL) || (str == NULL))
	return(XML_ERR_ARGUMENT);
    if (len < 0)
        len = xmlStrlen(str);
    if (len == 0)
        return(XML_ERR_OK);

    /* Note that both buf->size and buf->use can be zero here. */
    if ((unsigned) len >= buf->size - buf->use) {
        if (xmlBufferGrow(buf, len) < 0)
            return(XML_ERR_NO_MEMORY);
    }

    memmove(&buf->content[buf->use], str, len);
    buf->use += len;
    buf->content[buf->use] = 0;
    return(XML_ERR_OK);
}